

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O0

int codebook_decode_scalar_raw(vorb *f,Codebook *c)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int m;
  int len;
  int n;
  int x;
  uint32 code;
  int i;
  Codebook *c_local;
  vorb *f_local;
  
  prep_huffman(f);
  if ((c->codewords == (uint32 *)0x0) && (c->sorted_codewords == (uint32 *)0x0)) {
    return -1;
  }
  if (c->entries < 9) {
    if (c->codewords == (uint32 *)0x0) goto LAB_001233fa;
  }
  else if (c->sorted_codewords != (uint32 *)0x0) {
LAB_001233fa:
    uVar3 = bit_reverse(f->acc);
    len = 0;
    iVar2 = c->sorted_entries;
    while (m = iVar2, 1 < m) {
      iVar4 = m >> 1;
      iVar2 = iVar4;
      if (c->sorted_codewords[len + iVar4] <= uVar3) {
        iVar2 = m - iVar4;
        len = len + iVar4;
      }
    }
    if (c->sparse == '\0') {
      len = c->sorted_values[len];
    }
    bVar1 = c->codeword_lengths[len];
    if ((int)(uint)bVar1 <= f->valid_bits) {
      f->acc = f->acc >> (bVar1 & 0x1f);
      f->valid_bits = f->valid_bits - (uint)bVar1;
      return len;
    }
    f->valid_bits = 0;
    return -1;
  }
  if (c->sparse != '\0') {
    __assert_fail("!c->sparse",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/stb/stb_vorbis.h"
                  ,0x691,"int codebook_decode_scalar_raw(vorb *, Codebook *)");
  }
  x = 0;
  while( true ) {
    if (c->entries <= x) {
      error(f,VORBIS_invalid_stream);
      f->valid_bits = 0;
      return -1;
    }
    if ((c->codeword_lengths[x] != 0xff) &&
       (c->codewords[x] == (f->acc & (1 << (c->codeword_lengths[x] & 0x1f)) - 1U))) break;
    x = x + 1;
  }
  if ((int)(uint)c->codeword_lengths[x] <= f->valid_bits) {
    f->acc = f->acc >> (c->codeword_lengths[x] & 0x1f);
    f->valid_bits = f->valid_bits - (uint)c->codeword_lengths[x];
    return x;
  }
  f->valid_bits = 0;
  return -1;
}

Assistant:

static int codebook_decode_scalar_raw(vorb *f, Codebook *c)
{
   int i;
   prep_huffman(f);

   if (c->codewords == NULL && c->sorted_codewords == NULL)
      return -1;

   // cases to use binary search: sorted_codewords && !c->codewords
   //                             sorted_codewords && c->entries > 8
   if (c->entries > 8 ? c->sorted_codewords!=NULL : !c->codewords) {
      // binary search
      uint32 code = bit_reverse(f->acc);
      int x=0, n=c->sorted_entries, len;

      while (n > 1) {
         // invariant: sc[x] <= code < sc[x+n]
         int m = x + (n >> 1);
         if (c->sorted_codewords[m] <= code) {
            x = m;
            n -= (n>>1);
         } else {
            n >>= 1;
         }
      }
      // x is now the sorted index
      if (!c->sparse) x = c->sorted_values[x];
      // x is now sorted index if sparse, or symbol otherwise
      len = c->codeword_lengths[x];
      if (f->valid_bits >= len) {
         f->acc >>= len;
         f->valid_bits -= len;
         return x;
      }

      f->valid_bits = 0;
      return -1;
   }

   // if small, linear search
   assert(!c->sparse);
   for (i=0; i < c->entries; ++i) {
      if (c->codeword_lengths[i] == NO_CODE) continue;
      if (c->codewords[i] == (f->acc & ((1 << c->codeword_lengths[i])-1))) {
         if (f->valid_bits >= c->codeword_lengths[i]) {
            f->acc >>= c->codeword_lengths[i];
            f->valid_bits -= c->codeword_lengths[i];
            return i;
         }
         f->valid_bits = 0;
         return -1;
      }
   }

   error(f, VORBIS_invalid_stream);
   f->valid_bits = 0;
   return -1;
}